

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void world_act_npcs(void *world_void)

{
  Map *pMVar1;
  NPC *this;
  bool bVar2;
  reference ppMVar3;
  reference ppNVar4;
  double dVar5;
  NPC *npc;
  iterator __end2;
  iterator __begin2;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range2;
  Map *map;
  iterator __end1;
  iterator __begin1;
  vector<Map_*,_std::allocator<Map_*>_> *__range1;
  double current_time;
  World *world;
  void *world_void_local;
  
  dVar5 = Timer::GetTime();
  __end1 = std::vector<Map_*,_std::allocator<Map_*>_>::begin
                     ((vector<Map_*,_std::allocator<Map_*>_> *)((long)world_void + 0x4c8));
  map = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end
                         ((vector<Map_*,_std::allocator<Map_*>_> *)((long)world_void + 0x4c8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                *)&map);
    if (!bVar2) break;
    ppMVar3 = __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
              operator*(&__end1);
    pMVar1 = *ppMVar3;
    __end2 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&pMVar1->npcs);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&pMVar1->npcs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                  *)&npc);
      if (!bVar2) break;
      ppNVar4 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                operator*(&__end2);
      this = *ppNVar4;
      if (((this->alive & 1U) != 0) && (this->last_act + this->act_speed < dVar5)) {
        NPC::Act(this);
      }
      __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void world_act_npcs(void *world_void)
{
	World *world(static_cast<World *>(world_void));

	double current_time = Timer::GetTime();
	UTIL_FOREACH(world->maps, map)
	{
		UTIL_FOREACH(map->npcs, npc)
		{
			if (npc->alive && npc->last_act + npc->act_speed < current_time)
			{
				npc->Act();
			}
		}
	}
}